

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int OpenFiles(Context *context)

{
  int local_14;
  int is_ok;
  Context *context_local;
  
  local_14 = OpenInputFile(context->current_input_path,&context->fin);
  if ((context->test_integrity == 0) && (local_14 != 0)) {
    local_14 = OpenOutputFile(context->current_output_path,&context->fout,context->force_overwrite);
  }
  return local_14;
}

Assistant:

static BROTLI_BOOL OpenFiles(Context* context) {
  BROTLI_BOOL is_ok = OpenInputFile(context->current_input_path, &context->fin);
  if (!context->test_integrity && is_ok) {
    is_ok = OpenOutputFile(
        context->current_output_path, &context->fout, context->force_overwrite);
  }
  return is_ok;
}